

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
jessilib::
split_once<std::vector<unsigned_char,std::allocator<unsigned_char>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
          (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end,uchar in_delim)

{
  bool bVar1;
  reference puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  uchar *local_c8;
  uchar *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  uchar *local_90;
  uchar *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itr;
  undefined1 local_58 [8];
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  result;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_20;
  uchar in_delim_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin_local;
  
  result.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (uchar)end._M_current;
  _Stack_20._M_current = begin._M_current;
  end_local._M_current = (uchar *)this;
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
            ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_58);
  itr._M_current._7_1_ =
       __gnu_cxx::
       operator<=><unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 (&end_local,&stack0xffffffffffffffe0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    std::
    pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_58);
  }
  else {
    local_68._M_current = end_local._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        (&local_68,&stack0xffffffffffffffe0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_68);
      if (*puVar2 ==
          result.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_) {
        local_88 = end_local._M_current;
        local_90 = local_68._M_current;
        make_split_member<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nullptr>
                  (&local_80,end_local,local_68);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,&local_80);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_80);
        local_c0 = (uchar *)__gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+(&local_68,1);
        local_c8 = _Stack_20._M_current;
        make_split_member<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nullptr>
                  (&local_b8,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_c0,_Stack_20);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &result.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_b8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
        std::
        pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::pair(__return_storage_ptr__,
               (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_58);
        goto LAB_004d5aec;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_68);
    }
    make_split_member<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nullptr>
              (&local_e0,end_local,_Stack_20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,&local_e0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e0);
    std::
    pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_58);
  }
LAB_004d5aec:
  itr._M_current._0_4_ = 1;
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~pair((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)local_58);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}